

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_editor.cpp
# Opt level: O1

size_t __thiscall cmd_obj::render(cmd_obj *this,size_t buf_idx,size_t limit,string *sequence)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  string local_50;
  
  pcVar3 = COLOR_KEYWORD;
  uVar1 = (this->super_edit_object).buflen;
  sVar4 = uVar1 - buf_idx;
  if (limit + buf_idx <= uVar1) {
    sVar4 = limit;
  }
  if (buf_idx < 10) {
    pcVar2 = (char *)sequence->_M_string_length;
    strlen(COLOR_KEYWORD);
    std::__cxx11::string::_M_replace((ulong)sequence,0,pcVar2,(ulong)pcVar3);
    if (sVar4 + buf_idx < 0xb) {
      value_abi_cxx11_(&local_50,this);
      std::__cxx11::string::append((string *)sequence,(ulong)&local_50,buf_idx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)sequence);
      return sVar4;
    }
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::append((string *)sequence,(ulong)&local_50,buf_idx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)sequence);
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::append((string *)sequence,(ulong)&local_50,10);
  }
  else {
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::assign((string *)sequence,(ulong)&local_50,buf_idx);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return sVar4;
}

Assistant:

virtual size_t render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        if ((buf_idx + limit) > length())
            limit = length() - buf_idx;

        if (buf_idx >= 10) {
            sequence.assign(value(), buf_idx, limit);
        }
        else {
            sequence.assign(COLOR_KEYWORD);
            if ((buf_idx + limit) <= 10) {
                sequence.append(value(), buf_idx, limit);
                sequence.append(COLOR_NORMAL);
            }
            else {
                sequence.append(value(), buf_idx, 10 - buf_idx);
                sequence.append(COLOR_NORMAL);
                sequence.append(value(), 10, limit - (10 - buf_idx));
            }
        }

        return limit;
    }